

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
dynet::detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
          (initializer_list<dynet::Expression> *xs)

{
  VariableIndex VVar1;
  const_iterator pEVar2;
  size_type __n;
  const_iterator pEVar3;
  reference pvVar4;
  initializer_list<dynet::Expression> *in_RDI;
  const_iterator xi;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  ComputationGraph *pg;
  initializer_list<dynet::Expression> *in_stack_ffffffffffffff80;
  ComputationGraph *pCVar5;
  VariableIndex in_stack_ffffffffffffff8c;
  allocator_type *in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  const_iterator local_58;
  int local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  ComputationGraph *in_stack_ffffffffffffffc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  ComputationGraph *local_20;
  initializer_list<dynet::Expression> *local_18;
  Expression local_10;
  
  local_18 = in_RDI;
  pEVar2 = std::initializer_list<dynet::Expression>::begin(in_RDI);
  local_20 = pEVar2->pg;
  __n = std::initializer_list<dynet::Expression>::size(local_18);
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffc7;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17621c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this,__n,in_stack_ffffffffffffff90);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17623c);
  local_50 = 0;
  local_58 = std::initializer_list<dynet::Expression>::begin(local_18);
  while( true ) {
    pEVar2 = local_58;
    pEVar3 = std::initializer_list<dynet::Expression>::end(in_stack_ffffffffffffff80);
    if (pEVar2 == pEVar3) break;
    in_stack_ffffffffffffff8c = local_58->i;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_38,(long)local_50);
    *pvVar4 = in_stack_ffffffffffffff8c;
    local_58 = local_58 + 1;
    local_50 = local_50 + 1;
  }
  pCVar5 = local_20;
  VVar1 = ComputationGraph::
          add_function<dynet::AffineTransform,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Expression::Expression
            (pEVar2,(ComputationGraph *)CONCAT44(in_stack_ffffffffffffff8c,VVar1),
             (VariableIndex)((ulong)pCVar5 >> 0x20));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pEVar2);
  return local_10;
}

Assistant:

Expression f(const T& xs) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis));
}